

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItem::grabKeyboard(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsScene *pQVar2;
  
  pQVar1 = (this->d_ptr).d;
  pQVar2 = pQVar1->scene;
  if (pQVar2 == (QGraphicsScene *)0x0) {
    grabKeyboard();
  }
  else {
    if ((pQVar1->field_0x160 & 0x20) != 0) {
      QGraphicsScenePrivate::grabKeyboard(*(QGraphicsScenePrivate **)&pQVar2->field_0x8,this);
      return;
    }
    grabKeyboard();
  }
  return;
}

Assistant:

void QGraphicsItem::grabKeyboard()
{
    if (!d_ptr->scene) {
        qWarning("QGraphicsItem::grabKeyboard: cannot grab keyboard without scene");
        return;
    }
    if (!d_ptr->visible) {
        qWarning("QGraphicsItem::grabKeyboard: cannot grab keyboard while invisible");
        return;
    }
    d_ptr->scene->d_func()->grabKeyboard(this);
}